

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O3

__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __thiscall
rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>::
query(rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
      *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_begin,
     __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_end)

{
  int iVar1;
  ulong uVar2;
  pointer pvVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var16;
  ulong uVar17;
  ulong uVar18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  
  piVar10 = (this->_begin)._M_current;
  uVar21 = (long)range_begin._M_current - (long)piVar10 >> 2;
  uVar18 = (long)range_end._M_current - (long)piVar10 >> 2;
  if (uVar18 <= uVar21) {
    __assert_fail("begin_idx < end_idx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb5,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                 );
  }
  if (this->n < uVar18) {
    __assert_fail("end_idx <= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb6,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                 );
  }
  uVar23 = uVar21 - 1;
  uVar2 = this->superblock_size;
  uVar20 = uVar23 / uVar2 + 1;
  if (piVar10 == range_begin._M_current) {
    uVar20 = 0;
  }
  uVar5 = uVar18 / uVar2;
  uVar6 = uVar5 - uVar20;
  _Var19._M_current = range_begin._M_current;
  if (uVar20 <= uVar5 && uVar6 != 0) {
    uVar13 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar13 = uVar13 & 0xffffffff;
    pvVar3 = (this->superblock_mins).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->superblock_mins).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
            -0x5555555555555555;
    if (uVar13 <= uVar6 && uVar6 - uVar13 != 0) {
      lVar7 = *(long *)&pvVar3[uVar13].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data;
      uVar6 = (long)*(pointer *)
                     ((long)&pvVar3[uVar13].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data + 8) - lVar7 >> 3;
      if (uVar20 < uVar6) {
        uVar13 = uVar5 - (long)(1 << ((byte)uVar13 & 0x1f));
        if (uVar6 <= uVar13) {
          __assert_fail("dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0xcb,
                        "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                       );
        }
        _Var19._M_current = piVar10 + *(long *)(lVar7 + uVar20 * 8);
        if (piVar10[*(long *)(lVar7 + uVar13 * 8)] < piVar10[*(long *)(lVar7 + uVar20 * 8)]) {
          _Var19._M_current = piVar10 + *(long *)(lVar7 + uVar13 * 8);
        }
        goto LAB_00106d3b;
      }
    }
    __assert_fail("dist < superblock_mins.size() && left_sb < superblock_mins[dist].size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xc9,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                 );
  }
LAB_00106d3b:
  uVar6 = uVar20 - 1;
  if ((uVar6 < uVar5) && (uVar21 != uVar20 * uVar2)) {
    uVar13 = this->n_blocks_per_superblock;
    lVar7 = uVar23 / this->block_size + 1;
    uVar17 = this->block_size * lVar7;
    uVar8 = lVar7 - uVar13 * uVar6;
    if (uVar13 != uVar8) {
      uVar14 = ~uVar8 + uVar13;
      if (uVar14 == 0) {
        uVar12 = 0x40;
      }
      else {
        lVar7 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        uVar12 = (uint)lVar7 ^ 0x3f;
      }
      if (piVar10[(ulong)*(ushort *)
                          (uVar8 * 2 +
                           *(long *)&(this->block_mins).
                                     super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar12].
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data +
                          (uVar13 - (long)((1 << (-(char)uVar12 & 0x1fU)) / 2)) * uVar6 * 2) +
                  uVar6 * uVar2] < *_Var19._M_current) {
        _Var19._M_current =
             piVar10 + (ulong)*(ushort *)
                               (uVar8 * 2 +
                                *(long *)&(this->block_mins).
                                          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar12].
                                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                          ._M_impl.super__Vector_impl_data +
                               (uVar13 - (long)((1 << (-(char)uVar12 & 0x1fU)) / 2)) * uVar6 * 2) +
                       uVar6 * uVar2;
      }
    }
    if (uVar21 <= uVar17 && uVar17 - uVar21 != 0) {
      piVar9 = piVar10 + uVar17;
      piVar11 = range_begin._M_current + 1;
      _Var16._M_current = range_begin._M_current;
      if (piVar11 != piVar9 && piVar9 != range_begin._M_current) {
        iVar4 = *range_begin._M_current;
        do {
          if (*piVar11 < iVar4) {
            _Var16._M_current = piVar11;
            iVar4 = *piVar11;
          }
          piVar11 = piVar11 + 1;
        } while (piVar11 != piVar9);
      }
      if (*_Var16._M_current < *_Var19._M_current) {
        _Var19._M_current = _Var16._M_current;
      }
    }
  }
  if (((uVar20 <= uVar5) && (uVar5 != this->n_superblocks)) &&
     (uVar13 = uVar5 * uVar2, uVar18 != uVar13)) {
    lVar7 = this->n_blocks_per_superblock * uVar5;
    uVar8 = uVar18 / this->block_size;
    uVar17 = uVar8 - lVar7;
    if (uVar17 != 0) {
      uVar14 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      iVar15 = 1 << ((byte)uVar14 & 0x1f);
      lVar22 = (long)(iVar15 / 2) * uVar5;
      lVar24 = *(long *)((long)&(((this->block_mins).
                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
                                ._M_impl.super__Vector_impl_data +
                        ((uVar14 & 0xffffffff) * 3 & 0xffffffff) * 8);
      iVar4 = piVar10[*(ushort *)(lVar24 + (lVar7 - lVar22) * 2) + uVar13];
      iVar1 = *_Var19._M_current;
      if (iVar4 < *_Var19._M_current) {
        _Var19._M_current = piVar10 + *(ushort *)(lVar24 + (lVar7 - lVar22) * 2) + uVar13;
        iVar1 = iVar4;
      }
      if (piVar10[*(ushort *)(lVar24 + (uVar8 - (iVar15 + lVar22)) * 2) + uVar13] < iVar1) {
        _Var19._M_current = piVar10 + *(ushort *)(lVar24 + (uVar8 - (iVar15 + lVar22)) * 2) + uVar13
        ;
      }
    }
    uVar8 = uVar8 * this->block_size;
    if (uVar8 < uVar18) {
      piVar11 = piVar10 + uVar8;
      piVar9 = piVar10 + uVar8 + 1;
      if (piVar9 != range_end._M_current && piVar11 != range_end._M_current) {
        iVar4 = *piVar11;
        do {
          if (*piVar9 < iVar4) {
            piVar11 = piVar9;
            iVar4 = *piVar9;
          }
          piVar9 = piVar9 + 1;
        } while (piVar9 != range_end._M_current);
      }
      if (*piVar11 < *_Var19._M_current) {
        _Var19._M_current = piVar11;
      }
    }
  }
  if (uVar5 < uVar20) {
    uVar5 = this->block_size;
    uVar23 = uVar23 / uVar5 + 1;
    if (piVar10 == range_begin._M_current) {
      uVar23 = 0;
    }
    uVar13 = uVar18 / uVar5;
    uVar8 = uVar13 - uVar23;
    if (uVar13 < uVar23 || uVar8 == 0) {
      piVar10 = range_begin._M_current + 1;
      if (piVar10 != range_end._M_current && range_begin._M_current != range_end._M_current) {
        iVar4 = *range_begin._M_current;
        do {
          if (*piVar10 < iVar4) {
            range_begin._M_current = piVar10;
            iVar4 = *piVar10;
          }
          piVar10 = piVar10 + 1;
        } while (piVar10 != range_end._M_current);
      }
      if (*range_begin._M_current < *_Var19._M_current) {
        _Var19._M_current = range_begin._M_current;
      }
    }
    else {
      if (uVar23 / this->n_blocks_per_superblock != uVar13 / this->n_blocks_per_superblock) {
        __assert_fail("left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                      ,0x114,
                      "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                     );
      }
      uVar17 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      iVar4 = 1 << ((byte)uVar17 & 0x1f);
      if (uVar20 < 2) {
        lVar24 = 0;
        lVar7 = 0;
      }
      else {
        lVar7 = (long)(iVar4 / 2) * uVar6;
        lVar24 = uVar2 * uVar6;
      }
      lVar22 = *(long *)&(this->block_mins).
                         super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17 & 0xffffffff].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data;
      iVar1 = piVar10[(ulong)*(ushort *)(lVar22 + (uVar23 - lVar7) * 2) + lVar24];
      iVar15 = *_Var19._M_current;
      if (iVar1 < *_Var19._M_current) {
        _Var19._M_current = piVar10 + (ulong)*(ushort *)(lVar22 + (uVar23 - lVar7) * 2) + lVar24;
        iVar15 = iVar1;
      }
      if (piVar10[(ulong)*(ushort *)(lVar22 + (uVar13 - (iVar4 + lVar7)) * 2) + lVar24] < iVar15) {
        _Var19._M_current =
             piVar10 + (ulong)*(ushort *)(lVar22 + (uVar13 - (iVar4 + lVar7)) * 2) + lVar24;
      }
      if (uVar21 < uVar23 * uVar5) {
        piVar9 = piVar10 + uVar23 * uVar5;
        piVar11 = range_begin._M_current + 1;
        if (piVar11 != piVar9 && piVar9 != range_begin._M_current) {
          iVar4 = *range_begin._M_current;
          do {
            if (*piVar11 < iVar4) {
              range_begin._M_current = piVar11;
              iVar4 = *piVar11;
            }
            piVar11 = piVar11 + 1;
          } while (piVar11 != piVar9);
        }
        if (*range_begin._M_current < *_Var19._M_current) {
          _Var19._M_current = range_begin._M_current;
        }
      }
      uVar13 = uVar13 * uVar5;
      if (uVar13 < uVar18) {
        piVar11 = piVar10 + uVar13;
        piVar10 = piVar10 + uVar13 + 1;
        if (piVar10 != range_end._M_current && piVar11 != range_end._M_current) {
          iVar4 = *piVar11;
          do {
            if (*piVar10 < iVar4) {
              piVar11 = piVar10;
              iVar4 = *piVar10;
            }
            piVar10 = piVar10 + 1;
          } while (piVar10 != range_end._M_current);
        }
        if (*piVar11 < *_Var19._M_current) {
          _Var19._M_current = piVar11;
        }
      }
    }
  }
  return (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_Var19._M_current;
}

Assistant:

Iterator query(Iterator range_begin, Iterator range_end) {
        // find superblocks fully contained within range
        index_t begin_idx = std::distance(_begin, range_begin);
        index_t end_idx = std::distance(_begin, range_end);
        assert(begin_idx < end_idx);
        assert(end_idx <= n);

        // round up to next superblock
        index_t left_sb  = (begin_idx - 1) / superblock_size + 1;
        if (begin_idx == 0)
            left_sb = 0;
        // round down to prev superblock
        index_t right_sb = end_idx / superblock_size;

        // init result
        Iterator min_pos = range_begin;

        // if there is at least one superblock
        if (left_sb < right_sb) {
            // get largest power of two that doesn't exceed the number of
            // superblocks from (left,right)
            index_t n_sb = right_sb - left_sb;
            unsigned int dist = floorlog2(n_sb);

            assert(dist < superblock_mins.size() && left_sb < superblock_mins[dist].size());
            min_pos = _begin + superblock_mins[dist][left_sb];
            assert(dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size());
            Iterator right_sb_min = _begin + superblock_mins[dist][right_sb - (1 << dist)];
            if (*min_pos > *right_sb_min) {
                min_pos = right_sb_min;
            }
        }

        // go to left -> blocks -> sub-block
        if (left_sb <= right_sb && left_sb != 0 && begin_idx != left_sb*superblock_size) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            index_t left_b_gidx = left_b * block_size;
            left_b -= (left_sb - 1)*n_blocks_per_superblock;
            index_t n_b = n_blocks_per_superblock - left_b;
            if (n_b > 0) {
                unsigned int level = ceillog2(n_b);
                index_t sb_offset = (left_sb-1)*(n_blocks_per_superblock - (1<<level)/2);
                Iterator block_min_it = _begin + block_mins[level][left_b + sb_offset] + (left_sb-1)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go left into remaining block, if elements left
            if (left_b_gidx > begin_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b_gidx);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // go to right -> blocks -> sub-block
        if (left_sb <= right_sb && right_sb != n_superblocks && end_idx != right_sb*superblock_size) {
            index_t left_b = right_sb*n_blocks_per_superblock;
            index_t right_b = end_idx / block_size;
            index_t n_b = right_b - left_b;
            if (n_b > 0) {
                unsigned int dist = floorlog2(n_b);
                index_t sb_offset = right_sb*((1<<dist)/2);
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go right into remaining block, if elements left
            index_t left_gl_idx = right_b*block_size;
            if (left_gl_idx < end_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(_begin + left_gl_idx, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // if there are no superblocks covered (both indeces in same superblock)
        if (left_sb > right_sb) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            if (begin_idx == 0)
                left_b = 0;
            index_t right_b = end_idx / block_size;


            if (left_b < right_b) {
                // if blocks are in between: get mins of blocks in range
                // NOTE: there was a while if-else block here to handle the
                //       case if blocks would span accross the boundary of two
                //       superblocks, this should however never happen
                //       git blame this line to find where this code was removed
                // assert blocks lie in the same superblock
                assert(left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock);

                unsigned int dist = floorlog2(right_b - left_b);
                index_t sb_offset = 0;
                index_t sb_size_offset = 0;
                if (left_sb > 1) {
                    sb_offset = (left_sb-1)*((1<<dist)/2);
                    sb_size_offset = (left_sb-1)*superblock_size;
                }
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;

                // remaining inblock
                if (begin_idx < left_b*block_size) {
                    Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b*block_size);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
                if (end_idx > right_b*block_size) {
                    Iterator inblock_min_it = std::min_element(_begin + right_b*block_size, range_end);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
            } else {
                // no blocks at all
                Iterator inblock_min_it = std::min_element(range_begin, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }

        }

        // return the minimum found
        return min_pos;
    }